

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_begin_read_from_memory(png_imagep image,png_const_voidp memory,size_t size)

{
  int iVar1;
  size_t size_local;
  png_const_voidp memory_local;
  png_imagep image_local;
  
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image != (png_imagep)0x0) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_memory: incorrect PNG_IMAGE_VERSION")
      ;
      return iVar1;
    }
  }
  else {
    if ((memory == (png_const_voidp)0x0) || (size == 0)) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_memory: invalid argument");
      return iVar1;
    }
    iVar1 = png_image_read_init(image);
    if (iVar1 != 0) {
      image->opaque->memory = (png_const_bytep)memory;
      image->opaque->size = size;
      image->opaque->png_ptr->io_ptr = image;
      image->opaque->png_ptr->read_data_fn = png_image_memory_read;
      iVar1 = png_safe_execute(image,png_image_read_header,image);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int PNGAPI png_image_begin_read_from_memory(png_imagep image,
    png_const_voidp memory, size_t size)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (memory != NULL && size > 0)
      {
         if (png_image_read_init(image) != 0)
         {
            /* Now set the IO functions to read from the memory buffer and
             * store it into io_ptr.  Again do this in-place to avoid calling a
             * libpng function that requires error handling.
             */
            image->opaque->memory = png_voidcast(png_const_bytep, memory);
            image->opaque->size = size;
            image->opaque->png_ptr->io_ptr = image;
            image->opaque->png_ptr->read_data_fn = png_image_memory_read;

            return png_safe_execute(image, png_image_read_header, image);
         }
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_memory: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_memory: incorrect PNG_IMAGE_VERSION");

   return 0;
}